

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Joint.h
# Opt level: O0

void __thiscall
RigidBodyDynamics::Joint::Joint(Joint *this,JointType joint_type,Vector3d *joint_axis)

{
  undefined1 auVar1 [16];
  double *v4;
  ulong uVar2;
  int in_ESI;
  undefined8 *in_RDI;
  Index in_stack_ffffffffffffff38;
  DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *in_stack_ffffffffffffff40;
  DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *this_00;
  double *local_80;
  double *v3;
  double *in_stack_ffffffffffffffa8;
  double *pdVar3;
  double *in_stack_ffffffffffffffb0;
  double *v1;
  double *in_stack_ffffffffffffffb8;
  double *v0;
  SpatialVector_t *in_stack_ffffffffffffffc0;
  double *in_stack_ffffffffffffffd0;
  
  *(undefined4 *)((long)in_RDI + 0xc) = 1;
  v4 = (double *)CONCAT44(0,*(uint *)((long)in_RDI + 0xc));
  auVar1._8_8_ = 0;
  auVar1._0_8_ = v4;
  uVar2 = SUB168(auVar1 * ZEXT816(0x30),0);
  if (SUB168(auVar1 * ZEXT816(0x30),8) != 0) {
    uVar2 = 0xffffffffffffffff;
  }
  local_80 = (double *)operator_new__(uVar2);
  v3 = local_80;
  if (v4 != (double *)0x0) {
    pdVar3 = local_80 + (long)v4 * 6;
    do {
      SpatialVector_t::SpatialVector_t((SpatialVector_t *)0x849340);
      local_80 = local_80 + 6;
    } while (local_80 != pdVar3);
  }
  *in_RDI = v3;
  *(int *)(in_RDI + 1) = in_ESI;
  if (in_ESI == 1) {
    Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
              (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
              (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
              (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    SpatialVector_t::set
              ((SpatialVector_t *)0x0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
               in_stack_ffffffffffffffa8,v3,v4,(double *)0x0);
  }
  else if (in_ESI == 2) {
    this_00 = (DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *)*in_RDI;
    v0 = (double *)0x0;
    v1 = (double *)0x0;
    pdVar3 = (double *)0x0;
    Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
              (this_00,in_stack_ffffffffffffff38);
    Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
              (this_00,in_stack_ffffffffffffff38);
    Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
              (this_00,in_stack_ffffffffffffff38);
    SpatialVector_t::set(in_stack_ffffffffffffffc0,v0,v1,pdVar3,v3,v4,in_stack_ffffffffffffffd0);
  }
  return;
}

Assistant:

Joint (
    const JointType joint_type,
    const Math::Vector3d &joint_axis
  )
  {
    mDoFCount = 1;
    mJointAxes = new Math::SpatialVector[mDoFCount];

    // Some assertions, as we concentrate on simple cases

    // Only rotation around the Z-axis
    assert ( joint_type == JointTypeRevolute || joint_type == JointTypePrismatic );

    mJointType = joint_type;

    if (joint_type == JointTypeRevolute) {
      // make sure we have a unit axis
      mJointAxes[0].set (
        joint_axis[0],
        joint_axis[1],
        joint_axis[2],
        0., 0., 0.
      );

    } else if (joint_type == JointTypePrismatic) {
      // make sure we have a unit axis
#ifndef RBDL_USE_CASADI_MATH
      assert (joint_axis.squaredNorm() == 1.);
#endif

      mJointAxes[0].set (
        0., 0., 0.,
        joint_axis[0],
        joint_axis[1],
        joint_axis[2]
      );
    }
  }